

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

void __thiscall
HEVCStreamReader::updateStreamFps
          (HEVCStreamReader *this,void *nalUnit,uint8_t *buff,uint8_t *nextNal,int param_4)

{
  int iVar1;
  uint8_t *dstBuffer;
  VodCoreException *pVVar2;
  int iVar3;
  string local_390;
  ostringstream local_370 [8];
  ostringstream ss_1;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream ss;
  int newSpsLen;
  uint8_t *tmpBuffer;
  HevcVpsUnit *vps;
  int oldNalSize;
  int param_4_local;
  uint8_t *nextNal_local;
  uint8_t *buff_local;
  void *nalUnit_local;
  HEVCStreamReader *this_local;
  
  iVar3 = (int)nextNal - (int)buff;
  this->m_vpsSizeDiff = 0;
  HevcVpsUnit::setFPS((HevcVpsUnit *)nalUnit,(this->super_MPEGStreamReader).m_fps);
  iVar1 = HevcUnit::nalBufferLen((HevcUnit *)nalUnit);
  dstBuffer = (uint8_t *)operator_new__((long)(iVar1 + 0x10));
  iVar1 = HevcUnit::nalBufferLen((HevcUnit *)nalUnit);
  iVar1 = HevcUnit::serializeBuffer((HevcUnit *)nalUnit,dstBuffer,dstBuffer + (long)iVar1 + 0x10);
  if (iVar1 == -1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::operator<<((ostream *)local_1c0,"Not enough buffer");
    pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar2,3,&local_1f0);
    __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd != (uint8_t *)0x0) &&
     (iVar1 != iVar3)) {
    this->m_vpsSizeDiff = iVar1 - iVar3;
    if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 <
        (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + this->m_vpsSizeDiff) {
      std::__cxx11::ostringstream::ostringstream(local_370);
      std::operator<<((ostream *)local_370,"Not enough buffer");
      pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar2,3,&local_390);
      __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    memmove(nextNal + this->m_vpsSizeDiff,nextNal,
            (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nextNal
           );
    (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd =
         (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + this->m_vpsSizeDiff;
  }
  memcpy(buff,dstBuffer,(long)iVar1);
  if (dstBuffer != (uint8_t *)0x0) {
    operator_delete__(dstBuffer);
  }
  return;
}

Assistant:

void HEVCStreamReader::updateStreamFps(void* nalUnit, uint8_t* buff, uint8_t* nextNal, int)
{
    const int oldNalSize = static_cast<int>(nextNal - buff);
    m_vpsSizeDiff = 0;
    const auto vps = static_cast<HevcVpsUnit*>(nalUnit);
    vps->setFPS(m_fps);
    const auto tmpBuffer = new uint8_t[vps->nalBufferLen() + 16];
    const int newSpsLen = vps->serializeBuffer(tmpBuffer, tmpBuffer + vps->nalBufferLen() + 16);
    if (newSpsLen == -1)
        THROW(ERR_COMMON, "Not enough buffer")

    if (m_bufEnd && newSpsLen != oldNalSize)
    {
        m_vpsSizeDiff = newSpsLen - oldNalSize;
        if (m_bufEnd + m_vpsSizeDiff > m_tmpBuffer + TMP_BUFFER_SIZE)
            THROW(ERR_COMMON, "Not enough buffer")
        memmove(nextNal + m_vpsSizeDiff, nextNal, m_bufEnd - nextNal);
        m_bufEnd += m_vpsSizeDiff;
    }
    memcpy(buff, tmpBuffer, newSpsLen);

    delete[] tmpBuffer;
}